

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ConcurrentDatabase::has_entry(ConcurrentDatabase *this,ResourceTag tag,Hash hash)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  pointer pDVar5;
  byte local_31;
  Hash local_28;
  Hash hash_local;
  ConcurrentDatabase *pCStack_18;
  ResourceTag tag_local;
  ConcurrentDatabase *this_local;
  
  local_28 = hash;
  hash_local._4_4_ = tag;
  pCStack_18 = this;
  if (((this->super_DatabaseInterface).impl)->imported_concurrent_metadata ==
      (ExportedMetadataHeader *)0x0) {
    bVar1 = DatabaseInterface::test_resource_filter(&this->super_DatabaseInterface,tag,hash);
    if (bVar1) {
      sVar4 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::count(this->primed_hashes + hash_local._4_4_,&local_28);
      if (sVar4 == 0) {
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
        if (bVar1) {
          pDVar5 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator->(&this->readonly_interface);
          uVar2 = (*pDVar5->_vptr_DatabaseInterface[5])(pDVar5,(ulong)hash_local._4_4_,local_28);
          if ((uVar2 & 1) != 0) {
            return true;
          }
        }
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->writeonly_interface);
        local_31 = 0;
        if (bVar1) {
          pDVar5 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator->(&this->writeonly_interface);
          iVar3 = (*pDVar5->_vptr_DatabaseInterface[5])(pDVar5,(ulong)hash_local._4_4_,local_28);
          local_31 = (byte)iVar3;
        }
        this_local._7_1_ = (bool)(local_31 & 1);
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ =
         find_entry_in_concurrent_metadata
                   (((this->super_DatabaseInterface).impl)->imported_concurrent_metadata,tag,hash);
  }
  return this_local._7_1_;
}

Assistant:

bool has_entry(ResourceTag tag, Hash hash) override
	{
		if (impl->imported_concurrent_metadata)
			return find_entry_in_concurrent_metadata(impl->imported_concurrent_metadata, tag, hash);

		if (!test_resource_filter(tag, hash))
			return false;

		if (primed_hashes[tag].count(hash))
			return true;

		// All threads must have called prepare and synchronized readonly_interface from that,
		// and from here on out readonly_interface is purely read-only, no need to lock just to check.
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return true;

		return writeonly_interface && writeonly_interface->has_entry(tag, hash);
	}